

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result __thiscall wabt::WastParser::ParseCatchInstrList(WastParser *this,CatchVector *catches)

{
  Var *this_00;
  anon_union_16_2_ecfd7102_for_Location_1 *paVar1;
  Expr *pEVar2;
  bool bVar3;
  Expr *pEVar4;
  bool bVar5;
  TokenType TVar6;
  Result RVar7;
  bool bVar8;
  Token token;
  Token local_f8;
  Catch local_b8;
  
  this_00 = &local_b8.var;
  bVar8 = false;
  bVar5 = false;
  do {
    TVar6 = Peek(this,0);
    if ((TVar6 & ~After) != Catch) {
      if (bVar5) {
        return (Result)Ok;
      }
      paVar1 = &local_b8.loc.field_1;
      local_b8.loc.filename._M_len = (size_t)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"catch","");
      local_f8.loc.filename._M_len = 0;
      local_f8.loc.filename._M_str = (char *)0x0;
      local_f8.loc.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_f8,
                 &local_b8,&local_b8.var);
      RVar7 = ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&local_f8,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8);
      if ((anon_union_16_2_ecfd7102_for_Location_1 *)local_b8.loc.filename._M_len == paVar1) {
        return (Result)RVar7.enum_;
      }
      operator_delete((void *)local_b8.loc.filename._M_len,
                      (long)local_b8.loc.field_1.field_1.offset + 1);
      return (Result)RVar7.enum_;
    }
    GetToken(&local_f8,this);
    local_b8.loc.field_1.field_1.offset = local_f8.loc.field_1.field_1.offset;
    local_b8.loc.filename._M_len = local_f8.loc.filename._M_len;
    local_b8.loc.filename._M_str = local_f8.loc.filename._M_str;
    Var::Var(this_00);
    local_b8.exprs.first_ = (Expr *)0x0;
    local_b8.exprs.last_ = (Expr *)0x0;
    local_b8.exprs.size_ = 0;
    Consume(&local_f8,this);
    if (local_f8.token_type_ == Catch) {
      RVar7 = ParseVar(this,this_00);
      if (RVar7.enum_ != Error) {
LAB_00140e33:
        RVar7 = ParseInstrList(this,&local_b8.exprs);
        if (RVar7.enum_ != Error) {
          std::vector<wabt::Catch,_std::allocator<wabt::Catch>_>::emplace_back<wabt::Catch>
                    (catches,&local_b8);
          bVar3 = true;
          bVar5 = true;
          pEVar4 = local_b8.exprs.first_;
          goto joined_r0x00140e6c;
        }
      }
      bVar3 = false;
      pEVar4 = local_b8.exprs.first_;
    }
    else {
      bVar3 = !bVar8;
      bVar8 = true;
      if (bVar3) goto LAB_00140e33;
      bVar3 = false;
      Error(this,0x177ce3);
      bVar8 = true;
      pEVar4 = local_b8.exprs.first_;
    }
joined_r0x00140e6c:
    while (pEVar4 != (Expr *)0x0) {
      pEVar2 = (pEVar4->super_intrusive_list_base<wabt::Expr>).next_;
      (*pEVar4->_vptr_Expr[1])();
      pEVar4 = pEVar2;
    }
    local_b8.exprs.first_ = (Expr *)0x0;
    local_b8.exprs.last_ = (Expr *)0x0;
    local_b8.exprs.size_ = 0;
    Var::~Var(this_00);
    if (!bVar3) {
      return (Result)Error;
    }
  } while( true );
}

Assistant:

Result WastParser::ParseCatchInstrList(CatchVector* catches) {
  WABT_TRACE(ParseCatchInstrList);
  bool parsedCatch = false;
  bool parsedCatchAll = false;

  while (IsCatch(Peek())) {
    Catch catch_(GetLocation());

    auto token = Consume();
    if (token.token_type() == TokenType::Catch) {
      CHECK_RESULT(ParseVar(&catch_.var));
    } else {
      if (parsedCatchAll) {
        Error(token.loc, "multiple catch_all clauses not allowed");
        return Result::Error;
      }
      parsedCatchAll = true;
    }

    CHECK_RESULT(ParseInstrList(&catch_.exprs));
    catches->push_back(std::move(catch_));
    parsedCatch = true;
  }

  if (!parsedCatch) {
    return ErrorExpected({"catch"});
  }

  return Result::Ok;
}